

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

int Saig_ManPhaseFrameNum(Aig_Man_t *p,Vec_Int_t *vInits)

{
  int iVar1;
  int iVar2;
  Saig_Tsim_t *p_00;
  uint *pState;
  int nPrefix;
  int nFrames;
  Saig_Tsim_t *pTsi;
  Vec_Int_t *vInits_local;
  Aig_Man_t *p_local;
  
  iVar1 = Saig_ManRegNum(p);
  if (iVar1 == 0) {
    __assert_fail("Saig_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0x34d,"int Saig_ManPhaseFrameNum(Aig_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Saig_ManPiNum(p);
  if (iVar1 != 0) {
    iVar1 = Saig_ManPoNum(p);
    if (iVar1 != 0) {
      p_00 = Saig_ManReachableTernary(p,vInits,0);
      if (p_00 == (Saig_Tsim_t *)0x0) {
        p_local._4_4_ = 1;
      }
      else {
        pState = (uint *)Vec_PtrEntryLast(p_00->vStates);
        iVar1 = Saig_TsiComputePrefix(p_00,pState,p_00->nWords);
        iVar2 = Vec_PtrSize(p_00->vStates);
        p_local._4_4_ = (iVar2 + -1) - iVar1;
        Saig_TsiStop(p_00);
      }
      return p_local._4_4_;
    }
    __assert_fail("Saig_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0x34f,"int Saig_ManPhaseFrameNum(Aig_Man_t *, Vec_Int_t *)");
  }
  __assert_fail("Saig_ManPiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                ,0x34e,"int Saig_ManPhaseFrameNum(Aig_Man_t *, Vec_Int_t *)");
}

Assistant:

int Saig_ManPhaseFrameNum( Aig_Man_t * p, Vec_Int_t * vInits )
{
    Saig_Tsim_t * pTsi;
    int nFrames, nPrefix;
    assert( Saig_ManRegNum(p) );
    assert( Saig_ManPiNum(p) );
    assert( Saig_ManPoNum(p) );
    // perform terminary simulation
    pTsi = Saig_ManReachableTernary( p, vInits, 0 );
    if ( pTsi == NULL )
        return 1;
    // derive information
    nPrefix = Saig_TsiComputePrefix( pTsi, (unsigned *)Vec_PtrEntryLast(pTsi->vStates), pTsi->nWords );
    nFrames = Vec_PtrSize(pTsi->vStates) - 1 - nPrefix;
    Saig_TsiStop( pTsi );
    // potentially, may need to reduce nFrames if nPrefix is less than nFrames
    return nFrames;
}